

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  short sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  parasail_result_t *ppVar19;
  __m128i *palVar20;
  __m128i *ptr;
  int16_t *ptr_00;
  int16_t iVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  char *__format;
  ulong uVar27;
  undefined8 uVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  ulong size;
  __m128i *ptr_01;
  long lVar32;
  undefined8 unaff_R15;
  long lVar33;
  ushort uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar41;
  ushort uVar47;
  undefined1 auVar39 [16];
  __m128i alVar40;
  short sVar48;
  short sVar51;
  ulong uVar49;
  short sVar52;
  undefined1 auVar50 [16];
  ushort uVar53;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  undefined1 auVar54 [16];
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  undefined1 auVar70 [16];
  short sVar77;
  undefined1 auVar78 [16];
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffe98;
  __m128i *local_150;
  ushort local_d8;
  ushort uStack_d6;
  ushort local_98;
  ushort uStack_96;
  __m128i_16_t e;
  __m128i_16_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar22 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar22 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar22 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar22 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar22 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar22 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar22 = "open";
        }
        else {
          if (-1 < gap) {
            uVar26 = uVar3 - 1;
            size = (ulong)uVar3 + 7 >> 3;
            iVar24 = -open;
            iVar31 = ppVar5->min;
            iVar12 = -iVar31;
            if (iVar31 != iVar24 && SBORROW4(iVar31,iVar24) == iVar31 + open < 0) {
              iVar12 = open;
            }
            iVar31 = ppVar5->max;
            ppVar19 = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              ppVar19->flag = ppVar19->flag | 0x8220801;
              palVar20 = parasail_memalign___m128i(0x10,size);
              local_150 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0) &&
                  (local_150 != (__m128i *)0x0 && palVar20 != (__m128i *)0x0)) {
                iVar18 = s2Len + -1;
                auVar37 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar35 = auVar37._0_4_;
                auVar37 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar36 = auVar37._0_4_;
                auVar37 = pshuflw(ZEXT416(iVar12 - 0x7fff),ZEXT416(iVar12 - 0x7fff),0);
                local_d8 = auVar37._0_2_;
                uStack_d6 = auVar37._2_2_;
                auVar38 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),
                                                 0x7ffe - (short)iVar31));
                auVar38 = pshuflw(auVar38,auVar38,0);
                lVar23 = (long)iVar24;
                uVar28 = 0xffffffffffff8000;
                for (uVar27 = 0; uVar27 != size; uVar27 = uVar27 + 1) {
                  lVar29 = lVar23;
                  for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
                    lVar33 = -0x8000;
                    if (-0x8000 < lVar29) {
                      lVar33 = lVar29;
                    }
                    lVar32 = lVar29 - (ulong)(uint)open;
                    if (lVar32 < -0x7fff) {
                      lVar32 = -0x8000;
                    }
                    *(short *)((long)&h + lVar30 * 2) = (short)lVar33;
                    *(short *)((long)&e + lVar30 * 2) = (short)lVar32;
                    lVar29 = lVar29 - size * (uint)gap;
                  }
                  palVar20[uVar27][0] = h.m[0];
                  palVar20[uVar27][1] = h.m[1];
                  ptr[uVar27][0] = e.m[0];
                  ptr[uVar27][1] = e.m[1];
                  lVar23 = lVar23 - (ulong)(uint)gap;
                }
                *ptr_00 = 0;
                for (uVar27 = 1; s2Len + 1 != uVar27; uVar27 = uVar27 + 1) {
                  iVar21 = -0x8000;
                  if (-0x8000 < iVar24) {
                    iVar21 = (int16_t)iVar24;
                  }
                  ptr_00[uVar27] = iVar21;
                  iVar24 = iVar24 - gap;
                }
                uVar27 = 0;
                local_98 = auVar38._0_2_;
                uStack_96 = auVar38._2_2_;
                uVar53 = local_d8;
                uVar55 = uStack_d6;
                uVar56 = local_d8;
                uVar57 = uStack_d6;
                uVar58 = local_d8;
                uVar59 = uStack_d6;
                uVar60 = local_d8;
                uVar61 = uStack_d6;
                uVar62 = local_98;
                uVar63 = uStack_96;
                uVar64 = local_98;
                uVar65 = uStack_96;
                uVar66 = local_98;
                uVar67 = uStack_96;
                uVar68 = local_98;
                uVar69 = uStack_96;
                do {
                  ptr_01 = palVar20;
                  if (uVar27 == (uint)s2Len) {
                    alVar40 = ptr_01[(ulong)uVar26 % size];
                    iVar31 = 0;
                    while( true ) {
                      uVar27 = alVar40[0];
                      lVar23 = alVar40[1];
                      if (7 - (int)(uVar26 / size) <= iVar31) break;
                      alVar40[0] = uVar27 << 0x10;
                      alVar40[1] = lVar23 << 0x10 | uVar27 >> 0x30;
                      iVar31 = iVar31 + 1;
                    }
                    auVar37._0_2_ = -(ushort)((short)uVar62 < (short)local_d8);
                    auVar37._2_2_ = -(ushort)((short)uVar63 < (short)uStack_d6);
                    auVar37._4_2_ = -(ushort)((short)uVar64 < (short)local_d8);
                    auVar37._6_2_ = -(ushort)((short)uVar65 < (short)uStack_d6);
                    auVar37._8_2_ = -(ushort)((short)uVar66 < (short)local_d8);
                    auVar37._10_2_ = -(ushort)((short)uVar67 < (short)uStack_d6);
                    auVar37._12_2_ = -(ushort)((short)uVar68 < (short)local_d8);
                    auVar37._14_2_ = -(ushort)((short)uVar69 < (short)uStack_d6);
                    auVar54._0_2_ = -(ushort)((short)local_98 < (short)uVar53);
                    auVar54._2_2_ = -(ushort)((short)uStack_96 < (short)uVar55);
                    auVar54._4_2_ = -(ushort)((short)local_98 < (short)uVar56);
                    auVar54._6_2_ = -(ushort)((short)uStack_96 < (short)uVar57);
                    auVar54._8_2_ = -(ushort)((short)local_98 < (short)uVar58);
                    auVar54._10_2_ = -(ushort)((short)uStack_96 < (short)uVar59);
                    auVar54._12_2_ = -(ushort)((short)local_98 < (short)uVar60);
                    auVar54._14_2_ = -(ushort)((short)uStack_96 < (short)uVar61);
                    auVar54 = auVar54 | auVar37;
                    if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar54 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar54 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar54 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar54 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar54 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar54 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar54 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar54 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar54 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar54 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar54 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar54 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar54 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar54[0xf]) {
                      sVar51 = alVar40[1]._6_2_;
                    }
                    else {
                      *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                      sVar51 = 0;
                      iVar18 = 0;
                      uVar26 = 0;
                    }
                    ppVar19->score = (int)sVar51;
                    ppVar19->end_query = uVar26;
                    ppVar19->end_ref = iVar18;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_150);
                    parasail_free(ptr_01);
                    return ppVar19;
                  }
                  uVar25 = ptr_01[(int)size - 1][0];
                  iVar31 = ppVar5->mapper[(byte)s2[uVar27]];
                  auVar38._8_8_ = ptr_01[(int)size - 1][1] << 0x10 | uVar25 >> 0x30;
                  auVar38._0_8_ = uVar25 << 0x10 | (ulong)(ushort)ptr_00[uVar27];
                  lVar23 = 0;
                  auVar50._4_2_ = local_d8;
                  auVar50._0_4_ = auVar37._0_4_;
                  auVar50._6_2_ = uStack_d6;
                  auVar50._8_2_ = local_d8;
                  auVar50._10_2_ = uStack_d6;
                  auVar50._12_2_ = local_d8;
                  auVar50._14_2_ = uStack_d6;
                  for (uVar25 = 0; size != uVar25; uVar25 = uVar25 + 1) {
                    auVar70 = paddsw(auVar38,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar23 + (long)(iVar31 * (int)size) * 0x10));
                    pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar23);
                    sVar71 = *(short *)*pauVar2;
                    sVar72 = *(short *)(*pauVar2 + 2);
                    sVar73 = *(short *)(*pauVar2 + 4);
                    sVar74 = *(short *)(*pauVar2 + 6);
                    sVar75 = *(short *)(*pauVar2 + 8);
                    sVar76 = *(short *)(*pauVar2 + 10);
                    sVar77 = *(short *)(*pauVar2 + 0xc);
                    sVar13 = *(short *)(*pauVar2 + 0xe);
                    auVar38 = *pauVar2;
                    sVar51 = auVar50._0_2_;
                    uVar34 = (ushort)(sVar71 < sVar51) * sVar51 |
                             (ushort)(sVar71 >= sVar51) * sVar71;
                    sVar6 = auVar50._2_2_;
                    uVar41 = (ushort)(sVar72 < sVar6) * sVar6 | (ushort)(sVar72 >= sVar6) * sVar72;
                    sVar7 = auVar50._4_2_;
                    uVar42 = (ushort)(sVar73 < sVar7) * sVar7 | (ushort)(sVar73 >= sVar7) * sVar73;
                    sVar8 = auVar50._6_2_;
                    uVar43 = (ushort)(sVar74 < sVar8) * sVar8 | (ushort)(sVar74 >= sVar8) * sVar74;
                    sVar9 = auVar50._8_2_;
                    uVar44 = (ushort)(sVar75 < sVar9) * sVar9 | (ushort)(sVar75 >= sVar9) * sVar75;
                    sVar10 = auVar50._10_2_;
                    uVar45 = (ushort)(sVar76 < sVar10) * sVar10 |
                             (ushort)(sVar76 >= sVar10) * sVar76;
                    sVar11 = auVar50._12_2_;
                    uVar46 = (ushort)(sVar77 < sVar11) * sVar11 |
                             (ushort)(sVar77 >= sVar11) * sVar77;
                    sVar48 = auVar50._14_2_;
                    uVar47 = (ushort)(sVar13 < sVar48) * sVar48 |
                             (ushort)(sVar13 >= sVar48) * sVar13;
                    sVar52 = auVar70._0_2_;
                    uVar34 = (ushort)((short)uVar34 < sVar52) * sVar52 |
                             ((short)uVar34 >= sVar52) * uVar34;
                    sVar52 = auVar70._2_2_;
                    uVar41 = (ushort)((short)uVar41 < sVar52) * sVar52 |
                             ((short)uVar41 >= sVar52) * uVar41;
                    sVar52 = auVar70._4_2_;
                    uVar42 = (ushort)((short)uVar42 < sVar52) * sVar52 |
                             ((short)uVar42 >= sVar52) * uVar42;
                    sVar52 = auVar70._6_2_;
                    uVar43 = (ushort)((short)uVar43 < sVar52) * sVar52 |
                             ((short)uVar43 >= sVar52) * uVar43;
                    sVar52 = auVar70._8_2_;
                    uVar44 = (ushort)((short)uVar44 < sVar52) * sVar52 |
                             ((short)uVar44 >= sVar52) * uVar44;
                    sVar52 = auVar70._10_2_;
                    uVar45 = (ushort)((short)uVar45 < sVar52) * sVar52 |
                             ((short)uVar45 >= sVar52) * uVar45;
                    sVar52 = auVar70._12_2_;
                    uVar46 = (ushort)((short)uVar46 < sVar52) * sVar52 |
                             ((short)uVar46 >= sVar52) * uVar46;
                    sVar52 = auVar70._14_2_;
                    uVar47 = (ushort)((short)uVar47 < sVar52) * sVar52 |
                             ((short)uVar47 >= sVar52) * uVar47;
                    puVar1 = (ushort *)((long)*local_150 + lVar23);
                    *puVar1 = uVar34;
                    puVar1[1] = uVar41;
                    puVar1[2] = uVar42;
                    puVar1[3] = uVar43;
                    puVar1[4] = uVar44;
                    puVar1[5] = uVar45;
                    puVar1[6] = uVar46;
                    puVar1[7] = uVar47;
                    uVar53 = ((short)uVar53 < (short)uVar34) * uVar34 |
                             ((short)uVar53 >= (short)uVar34) * uVar53;
                    uVar55 = ((short)uVar55 < (short)uVar41) * uVar41 |
                             ((short)uVar55 >= (short)uVar41) * uVar55;
                    uVar56 = ((short)uVar56 < (short)uVar42) * uVar42 |
                             ((short)uVar56 >= (short)uVar42) * uVar56;
                    uVar57 = ((short)uVar57 < (short)uVar43) * uVar43 |
                             ((short)uVar57 >= (short)uVar43) * uVar57;
                    uVar58 = ((short)uVar58 < (short)uVar44) * uVar44 |
                             ((short)uVar58 >= (short)uVar44) * uVar58;
                    uVar59 = ((short)uVar59 < (short)uVar45) * uVar45 |
                             ((short)uVar59 >= (short)uVar45) * uVar59;
                    uVar60 = ((short)uVar60 < (short)uVar46) * uVar46 |
                             ((short)uVar60 >= (short)uVar46) * uVar60;
                    uVar61 = ((short)uVar61 < (short)uVar47) * uVar47 |
                             ((short)uVar61 >= (short)uVar47) * uVar61;
                    uVar62 = (ushort)(sVar71 < (short)uVar62) * sVar71 |
                             (sVar71 >= (short)uVar62) * uVar62;
                    uVar63 = (ushort)(sVar72 < (short)uVar63) * sVar72 |
                             (sVar72 >= (short)uVar63) * uVar63;
                    uVar64 = (ushort)(sVar73 < (short)uVar64) * sVar73 |
                             (sVar73 >= (short)uVar64) * uVar64;
                    uVar65 = (ushort)(sVar74 < (short)uVar65) * sVar74 |
                             (sVar74 >= (short)uVar65) * uVar65;
                    uVar66 = (ushort)(sVar75 < (short)uVar66) * sVar75 |
                             (sVar75 >= (short)uVar66) * uVar66;
                    uVar67 = (ushort)(sVar76 < (short)uVar67) * sVar76 |
                             (sVar76 >= (short)uVar67) * uVar67;
                    uVar68 = (ushort)(sVar77 < (short)uVar68) * sVar77 |
                             (sVar77 >= (short)uVar68) * uVar68;
                    uVar69 = (ushort)(sVar13 < (short)uVar69) * sVar13 |
                             (sVar13 >= (short)uVar69) * uVar69;
                    uVar62 = (ushort)(sVar51 < (short)uVar62) * sVar51 |
                             (sVar51 >= (short)uVar62) * uVar62;
                    uVar63 = (ushort)(sVar6 < (short)uVar63) * sVar6 |
                             (sVar6 >= (short)uVar63) * uVar63;
                    uVar64 = (ushort)(sVar7 < (short)uVar64) * sVar7 |
                             (sVar7 >= (short)uVar64) * uVar64;
                    uVar65 = (ushort)(sVar8 < (short)uVar65) * sVar8 |
                             (sVar8 >= (short)uVar65) * uVar65;
                    uVar66 = (ushort)(sVar9 < (short)uVar66) * sVar9 |
                             (sVar9 >= (short)uVar66) * uVar66;
                    uVar67 = (ushort)(sVar10 < (short)uVar67) * sVar10 |
                             (sVar10 >= (short)uVar67) * uVar67;
                    uVar68 = (ushort)(sVar11 < (short)uVar68) * sVar11 |
                             (sVar11 >= (short)uVar68) * uVar68;
                    uVar69 = (ushort)(sVar48 < (short)uVar69) * sVar48 |
                             (sVar48 >= (short)uVar69) * uVar69;
                    uVar62 = ((short)uVar34 < (short)uVar62) * uVar34 |
                             ((short)uVar34 >= (short)uVar62) * uVar62;
                    uVar63 = ((short)uVar41 < (short)uVar63) * uVar41 |
                             ((short)uVar41 >= (short)uVar63) * uVar63;
                    uVar64 = ((short)uVar42 < (short)uVar64) * uVar42 |
                             ((short)uVar42 >= (short)uVar64) * uVar64;
                    uVar65 = ((short)uVar43 < (short)uVar65) * uVar43 |
                             ((short)uVar43 >= (short)uVar65) * uVar65;
                    uVar66 = ((short)uVar44 < (short)uVar66) * uVar44 |
                             ((short)uVar44 >= (short)uVar66) * uVar66;
                    uVar67 = ((short)uVar45 < (short)uVar67) * uVar45 |
                             ((short)uVar45 >= (short)uVar67) * uVar67;
                    uVar68 = ((short)uVar46 < (short)uVar68) * uVar46 |
                             ((short)uVar46 >= (short)uVar68) * uVar68;
                    uVar69 = ((short)uVar47 < (short)uVar69) * uVar47 |
                             ((short)uVar47 >= (short)uVar69) * uVar69;
                    vH[0] = uVar25 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((ppVar19->field_4).rowcols)->score_row,vH,(int32_t)uVar27,s2Len
                                    ,(int32_t)uVar28,in_stack_fffffffffffffe98);
                    auVar17._2_2_ = uVar41;
                    auVar17._0_2_ = uVar34;
                    auVar17._4_2_ = uVar42;
                    auVar17._6_2_ = uVar43;
                    auVar17._8_2_ = uVar44;
                    auVar17._10_2_ = uVar45;
                    auVar17._12_2_ = uVar46;
                    auVar17._14_2_ = uVar47;
                    auVar78._4_4_ = uVar35;
                    auVar78._0_4_ = uVar35;
                    auVar78._8_4_ = uVar35;
                    auVar78._12_4_ = uVar35;
                    auVar78 = psubsw(auVar17,auVar78);
                    auVar70._4_4_ = uVar36;
                    auVar70._0_4_ = uVar36;
                    auVar70._8_4_ = uVar36;
                    auVar70._12_4_ = uVar36;
                    auVar38 = psubsw(auVar38,auVar70);
                    sVar51 = auVar78._0_2_;
                    sVar48 = auVar38._0_2_;
                    sVar52 = auVar78._2_2_;
                    sVar71 = auVar38._2_2_;
                    sVar6 = auVar78._4_2_;
                    sVar72 = auVar38._4_2_;
                    sVar7 = auVar78._6_2_;
                    sVar73 = auVar38._6_2_;
                    sVar8 = auVar78._8_2_;
                    sVar74 = auVar38._8_2_;
                    sVar9 = auVar78._10_2_;
                    sVar75 = auVar38._10_2_;
                    sVar10 = auVar78._12_2_;
                    sVar76 = auVar38._12_2_;
                    sVar77 = auVar38._14_2_;
                    sVar11 = auVar78._14_2_;
                    puVar1 = (ushort *)((long)*ptr + lVar23);
                    *puVar1 = (ushort)(sVar48 < sVar51) * sVar51 |
                              (ushort)(sVar48 >= sVar51) * sVar48;
                    puVar1[1] = (ushort)(sVar71 < sVar52) * sVar52 |
                                (ushort)(sVar71 >= sVar52) * sVar71;
                    puVar1[2] = (ushort)(sVar72 < sVar6) * sVar6 |
                                (ushort)(sVar72 >= sVar6) * sVar72;
                    puVar1[3] = (ushort)(sVar73 < sVar7) * sVar7 |
                                (ushort)(sVar73 >= sVar7) * sVar73;
                    puVar1[4] = (ushort)(sVar74 < sVar8) * sVar8 |
                                (ushort)(sVar74 >= sVar8) * sVar74;
                    puVar1[5] = (ushort)(sVar75 < sVar9) * sVar9 |
                                (ushort)(sVar75 >= sVar9) * sVar75;
                    puVar1[6] = (ushort)(sVar76 < sVar10) * sVar10 |
                                (ushort)(sVar76 >= sVar10) * sVar76;
                    puVar1[7] = (ushort)(sVar77 < sVar11) * sVar11 |
                                (ushort)(sVar77 >= sVar11) * sVar77;
                    auVar38 = psubsw(auVar50,auVar70);
                    sVar48 = auVar38._0_2_;
                    auVar50._0_2_ =
                         (ushort)(sVar48 < sVar51) * sVar51 | (ushort)(sVar48 >= sVar51) * sVar48;
                    sVar51 = auVar38._2_2_;
                    auVar50._2_2_ =
                         (ushort)(sVar51 < sVar52) * sVar52 | (ushort)(sVar51 >= sVar52) * sVar51;
                    sVar51 = auVar38._4_2_;
                    auVar50._4_2_ =
                         (ushort)(sVar51 < sVar6) * sVar6 | (ushort)(sVar51 >= sVar6) * sVar51;
                    sVar51 = auVar38._6_2_;
                    auVar50._6_2_ =
                         (ushort)(sVar51 < sVar7) * sVar7 | (ushort)(sVar51 >= sVar7) * sVar51;
                    sVar51 = auVar38._8_2_;
                    auVar50._8_2_ =
                         (ushort)(sVar51 < sVar8) * sVar8 | (ushort)(sVar51 >= sVar8) * sVar51;
                    sVar51 = auVar38._10_2_;
                    auVar50._10_2_ =
                         (ushort)(sVar51 < sVar9) * sVar9 | (ushort)(sVar51 >= sVar9) * sVar51;
                    sVar51 = auVar38._12_2_;
                    sVar52 = auVar38._14_2_;
                    auVar50._12_2_ =
                         (ushort)(sVar51 < sVar10) * sVar10 | (ushort)(sVar51 >= sVar10) * sVar51;
                    auVar50._14_2_ =
                         (ushort)(sVar52 < sVar11) * sVar11 | (ushort)(sVar52 >= sVar11) * sVar52;
                    auVar38 = *(undefined1 (*) [16])((long)*ptr_01 + lVar23);
                    lVar23 = lVar23 + 0x10;
                  }
                  for (iVar31 = 0; iVar31 != 8; iVar31 = iVar31 + 1) {
                    uVar25 = (ulong)(uint)(ptr_00[uVar27 + 1] - open);
                    if (ptr_00[uVar27 + 1] - open < -0x7fff) {
                      uVar25 = 0xffff8000;
                    }
                    uVar49 = auVar50._0_8_;
                    auVar50._8_8_ = auVar50._8_8_ << 0x10 | uVar49 >> 0x30;
                    auVar50._0_8_ = uVar49 << 0x10 | uVar25 & 0xffff;
                    uVar25 = 0;
                    palVar20 = local_150;
                    while (size != uVar25) {
                      sVar52 = (short)(*palVar20)[0];
                      sVar6 = *(short *)((long)*palVar20 + 2);
                      sVar7 = *(short *)((long)*palVar20 + 4);
                      sVar8 = *(short *)((long)*palVar20 + 6);
                      sVar9 = (short)(*palVar20)[1];
                      sVar10 = *(short *)((long)*palVar20 + 10);
                      sVar11 = *(short *)((long)*palVar20 + 0xc);
                      sVar48 = *(short *)((long)*palVar20 + 0xe);
                      sVar51 = auVar50._0_2_;
                      uVar34 = (ushort)(sVar52 < sVar51) * sVar51 |
                               (ushort)(sVar52 >= sVar51) * sVar52;
                      sVar51 = auVar50._2_2_;
                      uVar41 = (ushort)(sVar6 < sVar51) * sVar51 | (ushort)(sVar6 >= sVar51) * sVar6
                      ;
                      sVar51 = auVar50._4_2_;
                      uVar42 = (ushort)(sVar7 < sVar51) * sVar51 | (ushort)(sVar7 >= sVar51) * sVar7
                      ;
                      sVar51 = auVar50._6_2_;
                      uVar43 = (ushort)(sVar8 < sVar51) * sVar51 | (ushort)(sVar8 >= sVar51) * sVar8
                      ;
                      sVar51 = auVar50._8_2_;
                      uVar44 = (ushort)(sVar9 < sVar51) * sVar51 | (ushort)(sVar9 >= sVar51) * sVar9
                      ;
                      sVar51 = auVar50._10_2_;
                      uVar45 = (ushort)(sVar10 < sVar51) * sVar51 |
                               (ushort)(sVar10 >= sVar51) * sVar10;
                      sVar51 = auVar50._12_2_;
                      uVar46 = (ushort)(sVar11 < sVar51) * sVar51 |
                               (ushort)(sVar11 >= sVar51) * sVar11;
                      sVar51 = auVar50._14_2_;
                      uVar47 = (ushort)(sVar48 < sVar51) * sVar51 |
                               (ushort)(sVar48 >= sVar51) * sVar48;
                      *(ushort *)*palVar20 = uVar34;
                      *(ushort *)((long)*palVar20 + 2) = uVar41;
                      *(ushort *)((long)*palVar20 + 4) = uVar42;
                      *(ushort *)((long)*palVar20 + 6) = uVar43;
                      *(ushort *)(*palVar20 + 1) = uVar44;
                      *(ushort *)((long)*palVar20 + 10) = uVar45;
                      *(ushort *)((long)*palVar20 + 0xc) = uVar46;
                      *(ushort *)((long)*palVar20 + 0xe) = uVar47;
                      uVar62 = ((short)uVar34 < (short)uVar62) * uVar34 |
                               ((short)uVar34 >= (short)uVar62) * uVar62;
                      uVar63 = ((short)uVar41 < (short)uVar63) * uVar41 |
                               ((short)uVar41 >= (short)uVar63) * uVar63;
                      uVar64 = ((short)uVar42 < (short)uVar64) * uVar42 |
                               ((short)uVar42 >= (short)uVar64) * uVar64;
                      uVar65 = ((short)uVar43 < (short)uVar65) * uVar43 |
                               ((short)uVar43 >= (short)uVar65) * uVar65;
                      uVar66 = ((short)uVar44 < (short)uVar66) * uVar44 |
                               ((short)uVar44 >= (short)uVar66) * uVar66;
                      uVar67 = ((short)uVar45 < (short)uVar67) * uVar45 |
                               ((short)uVar45 >= (short)uVar67) * uVar67;
                      uVar68 = ((short)uVar46 < (short)uVar68) * uVar46 |
                               ((short)uVar46 >= (short)uVar68) * uVar68;
                      uVar69 = ((short)uVar47 < (short)uVar69) * uVar47 |
                               ((short)uVar47 >= (short)uVar69) * uVar69;
                      uVar53 = ((short)uVar53 < (short)uVar34) * uVar34 |
                               ((short)uVar53 >= (short)uVar34) * uVar53;
                      uVar55 = ((short)uVar55 < (short)uVar41) * uVar41 |
                               ((short)uVar55 >= (short)uVar41) * uVar55;
                      uVar56 = ((short)uVar56 < (short)uVar42) * uVar42 |
                               ((short)uVar56 >= (short)uVar42) * uVar56;
                      uVar57 = ((short)uVar57 < (short)uVar43) * uVar43 |
                               ((short)uVar57 >= (short)uVar43) * uVar57;
                      uVar58 = ((short)uVar58 < (short)uVar44) * uVar44 |
                               ((short)uVar58 >= (short)uVar44) * uVar58;
                      uVar59 = ((short)uVar59 < (short)uVar45) * uVar45 |
                               ((short)uVar59 >= (short)uVar45) * uVar59;
                      uVar60 = ((short)uVar60 < (short)uVar46) * uVar46 |
                               ((short)uVar60 >= (short)uVar46) * uVar60;
                      uVar61 = ((short)uVar61 < (short)uVar47) * uVar47 |
                               ((short)uVar61 >= (short)uVar47) * uVar61;
                      vH_00[0] = uVar25 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((ppVar19->field_4).rowcols)->score_row,vH_00,(int32_t)uVar27,
                                      s2Len,(int32_t)uVar28,in_stack_fffffffffffffe98);
                      auVar14._2_2_ = uVar41;
                      auVar14._0_2_ = uVar34;
                      auVar14._4_2_ = uVar42;
                      auVar14._6_2_ = uVar43;
                      auVar14._8_2_ = uVar44;
                      auVar14._10_2_ = uVar45;
                      auVar14._12_2_ = uVar46;
                      auVar14._14_2_ = uVar47;
                      auVar16._4_4_ = uVar35;
                      auVar16._0_4_ = uVar35;
                      auVar16._8_4_ = uVar35;
                      auVar16._12_4_ = uVar35;
                      auVar38 = psubsw(auVar14,auVar16);
                      auVar15._4_4_ = uVar36;
                      auVar15._0_4_ = uVar36;
                      auVar15._8_4_ = uVar36;
                      auVar15._12_4_ = uVar36;
                      auVar50 = psubsw(auVar50,auVar15);
                      auVar39._0_2_ = -(ushort)(auVar38._0_2_ < auVar50._0_2_);
                      auVar39._2_2_ = -(ushort)(auVar38._2_2_ < auVar50._2_2_);
                      auVar39._4_2_ = -(ushort)(auVar38._4_2_ < auVar50._4_2_);
                      auVar39._6_2_ = -(ushort)(auVar38._6_2_ < auVar50._6_2_);
                      auVar39._8_2_ = -(ushort)(auVar38._8_2_ < auVar50._8_2_);
                      auVar39._10_2_ = -(ushort)(auVar38._10_2_ < auVar50._10_2_);
                      auVar39._12_2_ = -(ushort)(auVar38._12_2_ < auVar50._12_2_);
                      auVar39._14_2_ = -(ushort)(auVar38._14_2_ < auVar50._14_2_);
                      uVar25 = uVar25 + 1;
                      palVar20 = palVar20 + 1;
                      if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar39 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar39 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar39 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar39 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar39 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar39 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar39 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar39 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar39 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar39 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar39 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar39 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar39._14_2_ >> 7 & 1) == 0) && (auVar39._14_2_ & 0x8000) == 0)
                      goto LAB_0066a379;
                    }
                  }
LAB_0066a379:
                  uVar27 = uVar27 + 1;
                  palVar20 = local_150;
                  local_150 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar22 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_striped_profile_sse41_128_16",pcVar22);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}